

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2ImageMap(LWOImporter *this,uint size,Texture *tex)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  float fVar4;
  uint8_t *next;
  allocator local_51;
  string local_50;
  SubChunkHeader local_30;
  SubChunkHeader head;
  uint8_t *end;
  Texture *tex_local;
  uint size_local;
  LWOImporter *this_local;
  
  head = (SubChunkHeader)((long)this->mFileBuffer + (ulong)size);
  while( true ) {
    if ((ulong)head <= (long)this->mFileBuffer + 6U) {
      return;
    }
    local_30 = IFF::LoadSubChunk(&this->mFileBuffer);
    if ((ulong)head < (ulong)((long)this->mFileBuffer + (long)(int)(uint)local_30.length)) break;
    puVar1 = this->mFileBuffer;
    uVar3 = (ulong)local_30.length;
    if (local_30.type == 0x41584953) {
      uVar2 = GetU2(this);
      tex->majorAxis = (uint)uVar2;
    }
    else if (local_30.type == 0x494d4147) {
      uVar2 = GetU2(this);
      tex->mClipIdx = (uint)uVar2;
    }
    else if (local_30.type == 0x50524f4a) {
      uVar2 = GetU2(this);
      tex->mapMode = (uint)uVar2;
    }
    else if (local_30.type == 0x564d4150) {
      GetS0(this,&tex->mUVChannelIndex,(uint)local_30.length);
    }
    else if (local_30.type == 0x57524150) {
      uVar2 = GetU2(this);
      tex->wrapModeWidth = (uint)uVar2;
      uVar2 = GetU2(this);
      tex->wrapModeHeight = (uint)uVar2;
    }
    else if (local_30.type == 0x57525048) {
      fVar4 = GetF4(this);
      tex->wrapAmountH = fVar4;
    }
    else if (local_30.type == 0x57525057) {
      fVar4 = GetF4(this);
      tex->wrapAmountW = fVar4;
    }
    this->mFileBuffer = puVar1 + uVar3;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"LWO2: Invalid SURF.BLOCK chunk length",&local_51);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void LWOImporter::LoadLWO2ImageMap(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid SURF.BLOCK chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_PROJ:
            tex.mapMode = (Texture::MappingMode)GetU2();
            break;
        case AI_LWO_WRAP:
            tex.wrapModeWidth  = (Texture::Wrap)GetU2();
            tex.wrapModeHeight = (Texture::Wrap)GetU2();
            break;
        case AI_LWO_AXIS:
            tex.majorAxis = (Texture::Axes)GetU2();
            break;
        case AI_LWO_IMAG:
            tex.mClipIdx = GetU2();
            break;
        case AI_LWO_VMAP:
            GetS0(tex.mUVChannelIndex,head.length);
            break;
        case AI_LWO_WRPH:
            tex.wrapAmountH = GetF4();
            break;
        case AI_LWO_WRPW:
            tex.wrapAmountW = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}